

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

int __thiscall
GrcSymbolTable::AddGlyphAttrSymbolInMap
          (GrcSymbolTable *this,
          vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *vpsymGlyphAttrIDs,
          Symbol psymGeneric,int ipsymToAssign)

{
  pointer ppGVar1;
  pointer ppGVar2;
  GrcSymbolTableEntry *local_30;
  Symbol local_28;
  
  ppGVar1 = (vpsymGlyphAttrIDs->
            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (vpsymGlyphAttrIDs->
            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ipsymToAssign < (int)((ulong)((long)ppGVar2 - (long)ppGVar1) >> 3)) {
    psymGeneric->m_nInternalID = ipsymToAssign;
    ppGVar1[ipsymToAssign] = psymGeneric;
  }
  else {
    local_28 = psymGeneric;
    while ((int)((ulong)((long)ppGVar2 - (long)ppGVar1) >> 3) < ipsymToAssign) {
      local_30 = (GrcSymbolTableEntry *)0x0;
      std::vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>>::
      emplace_back<GrcSymbolTableEntry*>
                ((vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>> *)
                 vpsymGlyphAttrIDs,&local_30);
      ppGVar1 = (vpsymGlyphAttrIDs->
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppGVar2 = (vpsymGlyphAttrIDs->
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    psymGeneric->m_nInternalID = ipsymToAssign;
    std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::push_back
              (vpsymGlyphAttrIDs,&local_28);
  }
  return ipsymToAssign;
}

Assistant:

int GrcSymbolTable::AddGlyphAttrSymbolInMap(std::vector<Symbol> & vpsymGlyphAttrIDs,
	Symbol psymGeneric, int ipsymToAssign)
{
	if (signed(vpsymGlyphAttrIDs.size()) > ipsymToAssign)
	{
		Assert(vpsymGlyphAttrIDs[ipsymToAssign] == NULL ||
			vpsymGlyphAttrIDs[ipsymToAssign] == psymGeneric);
		psymGeneric->SetInternalID(ipsymToAssign);
		vpsymGlyphAttrIDs[ipsymToAssign] = psymGeneric;
		return ipsymToAssign;
	}